

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O3

void __thiscall TextFile::TextFile(TextFile *this)

{
  ghc::filesystem::basic_fstream<char,_std::char_traits<char>_>::basic_fstream(&this->stream);
  ghc::filesystem::path::path(&this->fileName);
  (this->errorText)._M_dataplus._M_p = (pointer)&(this->errorText).field_2;
  (this->errorText)._M_string_length = 0;
  (this->errorText).field_2._M_local_buf[0] = '\0';
  (this->content)._M_dataplus._M_p = (pointer)&(this->content).field_2;
  (this->content)._M_string_length = 0;
  (this->content).field_2._M_local_buf[0] = '\0';
  (this->buf)._M_dataplus._M_p = (pointer)&(this->buf).field_2;
  (this->buf)._M_string_length = 0;
  (this->buf).field_2._M_local_buf[0] = '\0';
  this->recursion = false;
  this->errorRetrieved = false;
  this->fromMemory = false;
  this->bufPos = 0;
  this->lineCount = 0;
  return;
}

Assistant:

TextFile::TextFile()
{
	recursion = false;
	errorRetrieved = false;
	fromMemory = false;
	bufPos = 0;
	lineCount = 0;
}